

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void process(void)

{
  _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this;
  TileData *pTVar1;
  ushort uVar2;
  Png **ppPVar3;
  FILE *__stream;
  undefined8 uVar4;
  pointer pPVar5;
  bool bVar6;
  uint16_t uVar7;
  ComparisonResult CVar8;
  Palette *pal;
  reference pvVar9;
  ulong uVar10;
  const_iterator pvVar11;
  const_iterator pvVar12;
  TilesVisitor *pTVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  streambuf *psVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int *piVar15;
  unsigned_short uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  optional<File> *file;
  optional<File> *file_00;
  optional<File> *file_01;
  ProtoPalette *protoPal;
  pointer this_00;
  png_byte *ppVar20;
  DefaultInitVec<AttrmapEntry> *__range1;
  uint32_t y;
  uint32_t uVar21;
  char *pcVar22;
  uint32_t x;
  int iVar23;
  size_t sVar24;
  unsigned_long uVar25;
  Palette *palette;
  pointer ppTVar26;
  size_t protoPalID;
  long lVar27;
  pointer ppTVar28;
  Png *pPVar29;
  size_t i;
  Rgba *this_01;
  byte bVar30;
  byte bVar31;
  ProtoPalette *this_02;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Tile TVar34;
  undefined1 auStack_28548 [16];
  pointer pAStack_28538;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> protoPalettes;
  long lStack_28508;
  ProtoPalette tileColors;
  pointer puStack_284e8;
  undefined1 auStack_284c8 [24];
  Tile TStack_284b0;
  Rgba color;
  iterator iStack_28498;
  File output;
  iterator __end1;
  iterator __begin1;
  undefined1 auStack_28258 [16];
  TilesVisitor aTStack_28250 [8];
  bool bStack_28188;
  Png png;
  
  png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n");
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  Png::Png(&png,(path *)&options.input);
  if (2 < options.verbosity) {
    fputs("Image colors: [ ",_stderr);
    this_01 = (Rgba *)&png.colors;
    for (lVar27 = 0x28005; __stream = _stderr, lVar27 != 0; lVar27 = lVar27 + -5) {
      if (this_01[1].red == '\x01') {
        uVar21 = Rgba::toCSS(this_01);
        fprintf(__stream,"#%08x, ",(ulong)uVar21);
      }
      this_01 = (Rgba *)&this_01[1].green;
    }
    fputs("]\n",_stderr);
  }
  protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_28548 = (undefined1  [16])0x0;
  pAStack_28538 = (pointer)0x0;
  Png::visitAsTiles((TilesVisitor *)&output,&png);
  __begin1.limit =
       output._file.
       super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
       .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
       super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
       super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
       super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
       super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
       _20_4_;
  __begin1.x = 0;
  __begin1.y = 0;
  __begin1.parent = (TilesVisitor *)&output;
  Png::TilesVisitor::end(&__end1,(TilesVisitor *)&output);
  while( true ) {
    bVar6 = operator!=(&__begin1,&__end1);
    if (!bVar6) break;
    TVar34 = Png::TilesVisitor::iterator::operator*(&__begin1);
    tileColors._colorIndices._M_elems = (array<unsigned_short,_4UL>)(_Type)0xffffffffffffffff;
    pvVar9 = std::
             vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
             ::emplace_back<>((vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                               *)auStack_28548);
    uVar10 = TVar34._8_8_ >> 0x20;
    bVar30 = 0;
    auStack_284c8._8_8_ = uVar10;
    for (iVar17 = 0; iVar17 != 8; iVar17 = iVar17 + 1) {
      for (iVar23 = 0; iVar23 != 8; iVar23 = iVar23 + 1) {
        color = ((TVar34._png)->pixels).
                super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>.
                _M_impl.super__Vector_impl_data._M_start
                [(TVar34._png)->width * (int)uVar10 + TVar34.x + iVar23];
        if (0xfffffff < (uint)color) {
          uVar7 = Rgba::cgbColor(&color);
          bVar6 = ProtoPalette::add(&tileColors,uVar7);
          bVar30 = bVar30 + bVar6;
        }
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    bVar6 = ProtoPalette::empty(&tileColors);
    sVar24 = 0xffffffffffffffff;
    if (bVar6) {
LAB_0010da16:
      pvVar9->protoPaletteID = sVar24;
    }
    else {
      lVar27 = 0;
      sVar24 = 0;
      while( true ) {
        uVar10 = (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar10 <= sVar24) break;
        CVar8 = ProtoPalette::compare
                          (&tileColors,
                           (ProtoPalette *)
                           ((long)((protoPalettes.
                                    super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_colorIndices).
                                  _M_elems + lVar27));
        if (CVar8 == THEY_BIGGER) goto LAB_0010da16;
        if (CVar8 == WE_BIGGER) {
          *(array<unsigned_short,_4UL> *)
           protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
           super__Vector_impl_data._M_start[sVar24]._colorIndices._M_elems =
               tileColors._colorIndices._M_elems;
          goto LAB_0010da16;
        }
        sVar24 = sVar24 + 1;
        lVar27 = lVar27 + 8;
      }
      if ((byte)(options.nbColorsPerPal - options.hasTransparentPixels) < bVar30) {
        fatal("Tile at (%u, %u) has %zu opaque colors, more than %u!",TVar34._8_8_ & 0xffffffff,
              auStack_284c8._8_8_,(ulong)bVar30,
              (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels));
      }
      pvVar9->protoPaletteID = uVar10;
      if ((long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                _M_impl.super__Vector_impl_data._M_start == -8) {
        fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
              0xffffffffffffffff);
      }
      std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::push_back
                (&protoPalettes,&tileColors);
    }
    Png::TilesVisitor::iterator::operator++(&__begin1);
  }
  pcVar22 = "s";
  if ((long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    pcVar22 = "";
  }
  Options::verbosePrint
            (&options,'\x03',"Image contains %zu proto-palette%s\n",
             (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,pcVar22);
  if (2 < options.verbosity) {
    pPVar5 = protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar5;
        this_00 = this_00 + 1) {
      fputs("[ ",_stderr);
      pvVar11 = ProtoPalette::begin(this_00);
      pvVar12 = ProtoPalette::end(this_00);
      for (; pvVar11 != pvVar12; pvVar11 = pvVar11 + 1) {
        fprintf(_stderr,"$%04x, ",(ulong)*pvVar11);
      }
      fputs("]\n",_stderr);
    }
  }
  if (options.palSpecType == EMBEDDED) {
    if (png.embeddedPal == (png_colorp)0x0) {
      fatal("`-c embedded` was given, but the PNG does not have an embedded palette!");
    }
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
              (&options.palSpec);
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("options.palSpec.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x209,"generatePalSpec");
    }
    uVar19 = (uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
    if (png.nbColors < (int)(uint)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
      uVar19 = png.nbColors;
    }
    uVar18 = 0;
    uVar10 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar10 = uVar18;
    }
    ppVar20 = &(png.embeddedPal)->blue;
    for (; uVar10 != uVar18; uVar18 = uVar18 + 1) {
      if (png.transparencyPal == (png_bytep)0x0) {
        uVar19 = 0xff000000;
      }
      else {
        uVar19 = (uint)png.transparencyPal[uVar18] << 0x18;
      }
      uVar2._0_1_ = ((png_color *)(ppVar20 + -2))->red;
      uVar2._1_1_ = ((png_color *)(ppVar20 + -2))->green;
      (options.palSpec.
       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_start)->_M_elems[uVar18] =
           (Rgba)((uint)uVar2 | (uint)*ppVar20 << 0x10 | uVar19);
      ppVar20 = ppVar20 + 3;
    }
  }
  if (options.palSpecType == NO_SPEC) {
    packing::overloadAndRemove
              ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                *)&output,&protoPalettes);
    if (output._file.
        super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
        _16_8_ - output._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._8_8_ !=
        (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>._M_impl.
              super__Vector_impl_data._M_start) {
      __assert_fail("mappings.size() == protoPalettes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x218,"generatePalettes");
    }
    if (2 < options.verbosity) {
      pcVar22 = "s";
      if (output._file.
          super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
          .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u
          ._M_first._M_storage == (basic_streambuf<char,_std::char_traits<char>_> *)0x1) {
        pcVar22 = "";
      }
      fprintf(_stderr,"Proto-palette mappings: (%zu palette%s)\n",
              output._file.
              super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
              .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
              super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
              super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
              super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
              super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
              _M_u._M_first._M_storage,pcVar22);
      for (uVar10 = 0;
          uVar10 < (ulong)((long)(output._file.
                                  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                  .
                                  super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                  .
                                  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                  .
                                  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                  .
                                  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                  .
                                  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                  ._M_u._16_8_ -
                                 output._file.
                                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                 .
                                 super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 .
                                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                 ._M_u._8_8_) >> 3); uVar10 = uVar10 + 1) {
        fprintf(_stderr,"%zu -> %zu\n",uVar10,
                *(undefined8 *)
                 (output._file.
                  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  ._M_u._8_8_ + uVar10 * 8));
      }
    }
    this = (_Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)((long)&output._file.
                      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
              + 8);
    std::vector<Palette,_std::allocator<Palette>_>::vector
              ((vector<Palette,_std::allocator<Palette>_> *)&__begin1,
               (size_type)
               output._file.
               super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
               super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
               super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
               super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
               super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
               ._M_u._M_first._M_storage,(allocator_type *)&__end1);
    if (options.hasTransparentPixels != false) {
      for (pTVar13 = __begin1.parent; pTVar13 != (TilesVisitor *)CONCAT44(__begin1.x,__begin1.limit)
          ; pTVar13 = (TilesVisitor *)&pTVar13->_columnMajor) {
        *(undefined2 *)&pTVar13->_png = 0x8000;
      }
    }
    for (uVar10 = 0;
        uVar10 < (ulong)((long)(output._file.
                                super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                .
                                super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                .
                                super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                .
                                super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                .
                                super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                .
                                super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                ._M_u._16_8_ -
                               output._file.
                               super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                               .
                               super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               ._M_u._8_8_) >> 3); uVar10 = uVar10 + 1) {
      lVar27 = *(long *)(output._file.
                         super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                         .
                         super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                         .
                         super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                         .
                         super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                         .
                         super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                         .
                         super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                         ._M_u._8_8_ + uVar10 * 8);
      ppPVar3 = &(__begin1.parent)->_png;
      this_02 = protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar10;
      pvVar11 = ProtoPalette::begin(this_02);
      pvVar12 = ProtoPalette::end(this_02);
      for (; pvVar11 != pvVar12; pvVar11 = pvVar11 + 1) {
        Palette::addColor((Palette *)(ppPVar3 + lVar27),*pvVar11);
      }
    }
    if (png.embeddedPal == (png_colorp)0x0) {
      bVar6 = Png::isSuitableForGrayscale(&png);
      if (bVar6) {
        sorting::grayscale((vector<Palette,_std::allocator<Palette>_> *)&__begin1,
                           &png.colors._colors);
      }
      else {
        sorting::rgb((vector<Palette,_std::allocator<Palette>_> *)&__begin1);
      }
    }
    else {
      sorting::indexed((vector<Palette,_std::allocator<Palette>_> *)&__begin1,png.nbColors,
                       png.embeddedPal,png.transparencyPal);
    }
    std::
    _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
    ::
    _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
              ((_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
                *)&tileColors,
               (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)this,(vector<Palette,_std::allocator<Palette>_> *)&__begin1);
    std::_Vector_base<Palette,_std::allocator<Palette>_>::~_Vector_base
              ((_Vector_base<Palette,_std::allocator<Palette>_> *)&__begin1);
    std::
    _Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~_Vector_base(this);
  }
  else {
    makePalsAsSpecified((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                         *)&tileColors,&protoPalettes);
  }
  outputPalettes((vector<Palette,_std::allocator<Palette>_> *)&tileColors);
  if (options.allowDedup == false) {
    if ((uint)options.maxNbTiles._M_elems[1] + (uint)options.maxNbTiles._M_elems[0] <
        (png.width >> 3) * (png.height >> 3)) {
      fatal("Image contains %u tiles, exceeding the limit of %u + %u");
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating unoptimized tile data...\n");
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index
           = '\0';
      iVar17 = File::open(&output,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var,iVar17) == 0) {
        File::string((string *)&__begin1,&output,(path *)&options.output);
        pTVar13 = __begin1.parent;
        piVar15 = __errno_location();
        pcVar22 = strerror(*piVar15);
        fatal("Failed to open \"%s\": %s",pTVar13,pcVar22);
      }
      auVar32._0_2_ = -(ushort)(options.inputSlice.width == 0);
      auVar32._2_2_ = -(ushort)(options.inputSlice.height == 0);
      auVar32._4_2_ = 0xffff;
      auVar32._6_2_ = 0xffff;
      auVar32._8_2_ = 0xffff;
      auVar32._10_2_ = 0xffff;
      auVar32._12_2_ = 0xffff;
      auVar32._14_2_ = 0xffff;
      auVar33._0_4_ = png.width >> 3;
      auVar33._4_4_ = png.height >> 3;
      auVar33._8_8_ = 0;
      auVar33 = pshuflw(auVar33,auVar33,0xe8);
      auVar32 = ~auVar32 & ZEXT416((uint)options.inputSlice._4_4_) | auVar33 & auVar32;
      uVar10 = (ulong)auVar32._2_2_ * (ulong)auVar32._0_2_;
      lStack_28508 = uVar10 - options.trim;
      if (options.trim <= uVar10 && lStack_28508 != 0) {
        Png::visitAsTiles((TilesVisitor *)&__end1,&png);
        __begin1.limit = (uint32_t)__end1.parent;
        __begin1.x = (uint32_t)((ulong)__end1.parent >> 0x20);
        __begin1.y = __end1.limit;
        __begin1._20_4_ = __end1.x;
        __end1.parent = (TilesVisitor *)auStack_28548._0_8_;
        __end1.y = __end1._20_4_;
        __end1._20_4_ = 0;
        __end1._8_8_ = &__begin1.limit;
        __begin1.parent = (TilesVisitor *)auStack_28548;
        detail::
        ZipContainer<Png::TilesVisitor,_const_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_&>
        ::end((Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
               *)&color,
              (ZipContainer<Png::TilesVisitor,_const_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_&>
               *)&__begin1);
        while (bVar6 = operator!=((iterator *)&__end1.limit,&iStack_28498), bVar6) {
          Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
          ::operator*((type *)(auStack_284c8 + 0x10),
                      (Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
                       *)&__end1);
          if (*(_Hash_node_base **)auStack_284c8._16_8_ == (_Hash_node_base *)0xffffffffffffffff) {
            uVar25 = 0;
          }
          else {
            uVar25 = puStack_284e8[(long)*(_Hash_node_base **)auStack_284c8._16_8_];
          }
          palette = (Palette *)(uVar25 * 8 + (long)tileColors._colorIndices._M_elems);
          for (uVar21 = 0; uVar21 != 8; uVar21 = uVar21 + 1) {
            TileData::rowBitplanes(&TStack_284b0,palette,uVar21);
            psVar14 = File::operator*(&output);
            std::streambuf::sputc((char)psVar14);
            if (options.bitDepth == '\x02') {
              psVar14 = File::operator*(&output);
              std::streambuf::sputc((char)psVar14);
            }
          }
          lStack_28508 = lStack_28508 + -1;
          if (lStack_28508 == 0) goto LAB_0010e44b;
          Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
          ::operator++((Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
                        *)&__end1);
        }
        if (lStack_28508 != 0) {
          __assert_fail("remainingTiles == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x326,"outputTileData");
        }
      }
LAB_0010e44b:
      File::~File(&output);
    }
    if (((options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) ||
        (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
         _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
         super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false)) ||
       (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true)) {
      Options::verbosePrint
                (&options,'\x02',"Generating unoptimized tilemap and/or attrmap and/or palmap...\n")
      ;
      bStack_28188 = false;
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.tilemap,
                 (optional<std::filesystem::__cxx11::path> *)&output,file);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.attrmap,
                 (optional<std::filesystem::__cxx11::path> *)&__begin1,file_00);
      unoptimized::outputMaps::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&options.palmap,
                 (optional<std::filesystem::__cxx11::path> *)&__end1,file_01);
      uVar4 = auStack_28548._8_8_;
      bVar30 = 0;
      bVar31 = 0;
      for (pPVar29 = (Png *)auStack_28548._0_8_; pPVar29 != (Png *)uVar4;
          pPVar29 = (Png *)((long)&(pPVar29->file)._file.
                                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                   .
                                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           + 8)) {
        if (options.maxNbTiles._M_elems[bVar31] == (ushort)bVar30) {
          if (bVar31 != 0) {
            __assert_fail("bank == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x33d,"outputMaps");
          }
          bVar31 = 1;
          bVar30 = 0;
        }
        if (bStack_28188 == true) {
          psVar14 = File::operator*((File *)&__begin1);
          std::streambuf::sputc((char)psVar14);
        }
        bVar30 = bVar30 + 1;
      }
      std::_Optional_payload_base<File>::_M_reset((_Optional_payload_base<File> *)&__end1);
      std::_Optional_payload_base<File>::_M_reset((_Optional_payload_base<File> *)&__begin1);
      std::_Optional_payload_base<File>::_M_reset((_Optional_payload_base<File> *)&output);
    }
  }
  else {
    Options::verbosePrint(&options,'\x02',"Deduplicating tiles...\n");
    __begin1.parent = (TilesVisitor *)((long)register0x00000020 + -0x28250);
    __begin1.limit = 1;
    __begin1.x = 0;
    __begin1.y = 0;
    __begin1._20_4_ = 0;
    auStack_28258 = (undefined1  [16])0x0;
    aTStack_28250[0]._columnMajor = false;
    aTStack_28250[0]._9_3_ = 0;
    aTStack_28250[0]._width = 0;
    aTStack_28250[0]._height = 0;
    aTStack_28250[0]._limit = 0;
    aTStack_28250[1]._png = (Png *)0x0;
    Png::visitAsTiles((TilesVisitor *)&__end1,&png);
    output._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._8_8_
         = __end1.parent;
    output._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
    _16_4_ = __end1.limit;
    output._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
    _20_4_ = __end1.x;
    __end1.parent = (TilesVisitor *)auStack_28548._0_8_;
    __end1.y = __end1._20_4_;
    __end1._20_4_ = 0;
    output._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
    _M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         (basic_streambuf<char,_std::char_traits<char>_> *)auStack_28548;
    __end1._8_8_ = (undefined1 *)
                   ((long)&output._file.
                           super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                           .
                           super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           .
                           super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           .
                           super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           .
                           super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   + 8);
    detail::
    ZipContainer<Png::TilesVisitor,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_&>
    ::end((Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
           *)&color,
          (ZipContainer<Png::TilesVisitor,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_&>
           *)&output);
    while (bVar6 = operator!=((iterator *)&__end1.limit,&iStack_28498), bVar6) {
      Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
      ::operator*((type *)(auStack_284c8 + 0x10),
                  (Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
                   *)&__end1);
      uVar4 = auStack_284c8._16_8_;
      optimized::UniqueTiles::addTile
                ((UniqueTiles *)auStack_284c8,(Tile *)&__begin1,(Palette *)&TStack_284b0);
      *(bool *)((long)&((_Hash_node_base *)(uVar4 + 8))->_M_nxt + 3) =
           auStack_284c8._0_4_ == 2 || auStack_284c8._0_4_ == 4;
      *(bool *)((long)&((_Hash_node_base *)(uVar4 + 8))->_M_nxt + 2) =
           auStack_284c8._0_4_ == 3 || auStack_284c8._0_4_ == 4;
      uVar16 = options.maxNbTiles._M_elems[0];
      bVar6 = options.maxNbTiles._M_elems[0] <= (ushort)auStack_284c8._4_2_;
      *(bool *)((long)&((_Hash_node_base *)(uVar4 + 8))->_M_nxt + 1) = bVar6;
      if (!bVar6) {
        uVar16 = 0;
      }
      *(uchar *)&((_Hash_node_base *)(uVar4 + 8))->_M_nxt =
           ((char)auStack_284c8._4_2_ - (char)uVar16) + options.baseTileIDs._M_elems[bVar6];
      Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
      ::operator++((Zip<Png::TilesVisitor::iterator,___gnu_cxx::__normal_iterator<AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>_>
                    *)&__end1);
    }
    if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] <
        (ulong)((long)(aTStack_28250[0]._16_8_ - aTStack_28250[0]._8_8_) >> 3)) {
      fatal("Image contains %zu tiles, exceeding the limit of %u + %u");
    }
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tile data...\n");
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index
           = '\0';
      iVar17 = File::open(&output,(char *)&options.output,0x14);
      if (CONCAT44(extraout_var_00,iVar17) == 0) {
        File::string((string *)&__end1,&output,(path *)&options.output);
        pTVar13 = __end1.parent;
        piVar15 = __errno_location();
        pcVar22 = strerror(*piVar15);
        fatal("Failed to create \"%s\": %s",pTVar13,pcVar22);
      }
      ppTVar28 = (pointer)(aTStack_28250[0]._16_8_ + options.trim * -8);
      uVar7 = 0;
      for (ppTVar26 = (pointer)aTStack_28250[0]._8_8_; ppTVar26 != ppTVar28; ppTVar26 = ppTVar26 + 1
          ) {
        pTVar1 = *ppTVar26;
        if (uVar7 != pTVar1->tileID) {
          __assert_fail("tile->tileID == tileID",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x39e,"outputTileData");
        }
        psVar14 = File::operator*(&output);
        (**(code **)(*(long *)psVar14 + 0x60))(psVar14,pTVar1,(ulong)options.bitDepth << 3);
        uVar7 = uVar7 + 1;
      }
      File::~File(&output);
    }
    if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized tilemap...\n");
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index
           = '\0';
      iVar17 = File::open(&output,(char *)&options.tilemap,0x14);
      if (CONCAT44(extraout_var_01,iVar17) == 0) {
        File::string((string *)&__end1,&output,(path *)&options.tilemap);
        pTVar13 = __end1.parent;
        piVar15 = __errno_location();
        pcVar22 = strerror(*piVar15);
        fatal("Failed to create \"%s\": %s",pTVar13,pcVar22);
      }
      uVar4 = auStack_28548._8_8_;
      for (pPVar29 = (Png *)auStack_28548._0_8_; pPVar29 != (Png *)uVar4;
          pPVar29 = (Png *)((long)&(pPVar29->file)._file.
                                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                   .
                                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           + 8)) {
        psVar14 = File::operator*(&output);
        std::streambuf::sputc((char)psVar14);
      }
      File::~File(&output);
    }
    if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized attrmap...\n");
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index
           = '\0';
      iVar17 = File::open(&output,(char *)&options.attrmap,0x14);
      if (CONCAT44(extraout_var_02,iVar17) == 0) {
        File::string((string *)&__end1,&output,(path *)&options.attrmap);
        pTVar13 = __end1.parent;
        piVar15 = __errno_location();
        pcVar22 = strerror(*piVar15);
        fatal("Failed to create \"%s\": %s",pTVar13,pcVar22);
      }
      uVar4 = auStack_28548._8_8_;
      for (pPVar29 = (Png *)auStack_28548._0_8_; pPVar29 != (Png *)uVar4;
          pPVar29 = (Png *)((long)&(pPVar29->file)._file.
                                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                   .
                                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           + 8)) {
        psVar14 = File::operator*(&output);
        std::streambuf::sputc((char)psVar14);
      }
      File::~File(&output);
    }
    if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      Options::verbosePrint(&options,'\x02',"Generating optimized palmap...\n");
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      output._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index
           = '\0';
      iVar17 = File::open(&output,(char *)&options.palmap,0x14);
      if (CONCAT44(extraout_var_03,iVar17) == 0) {
        File::string((string *)&__end1,&output,(path *)&options.palmap);
        pTVar13 = __end1.parent;
        piVar15 = __errno_location();
        pcVar22 = strerror(*piVar15);
        fatal("Failed to create \"%s\": %s",pTVar13,pcVar22);
      }
      uVar4 = auStack_28548._8_8_;
      for (pPVar29 = (Png *)auStack_28548._0_8_; pPVar29 != (Png *)uVar4;
          pPVar29 = (Png *)((long)&(pPVar29->file)._file.
                                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                   .
                                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                                   .
                                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                           + 8)) {
        psVar14 = File::operator*(&output);
        std::streambuf::sputc((char)psVar14);
      }
      File::~File(&output);
    }
    optimized::UniqueTiles::~UniqueTiles((UniqueTiles *)&__begin1);
  }
  std::
  _Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                  *)&tileColors);
  std::
  _Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>::
  ~_Vector_base((_Vector_base<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
                 *)auStack_28548);
  std::_Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>::~_Vector_base
            (&protoPalettes.super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>);
  Png::~Png(&png);
  return;
}

Assistant:

void process() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	Png png(*options.input); // This also sets `hasTransparentPixels` as a side effect
	ImagePalette const &colors = png.getColors();

	// Now, we have all the image's colors in `colors`
	// The next step is to order the palette

	if (options.verbosity >= Options::VERB_INTERM) {
		fputs("Image colors: [ ", stderr);
		for (auto const &slot : colors) {
			if (!slot.has_value()) {
				continue;
			}
			fprintf(stderr, "#%08x, ", slot->toCSS());
		}
		fputs("]\n", stderr);
	}

	// Now, iterate through the tiles, generating proto-palettes as we go
	// We do this unconditionally because this performs the image validation (which we want to
	// perform even if no output is requested), and because it's necessary to generate any
	// output (with the exception of an un-duplicated tilemap, but that's an acceptable loss.)
	std::vector<ProtoPalette> protoPalettes;
	DefaultInitVec<AttrmapEntry> attrmap{};

	for (auto tile : png.visitAsTiles()) {
		ProtoPalette tileColors;
		AttrmapEntry &attrs = attrmap.emplace_back();
		uint8_t nbColorsInTile = 0;

		for (uint32_t y = 0; y < 8; ++y) {
			for (uint32_t x = 0; x < 8; ++x) {
				Rgba color = tile.pixel(x, y);
				if (!color.isTransparent()) { // Do not count transparency in for packing
					// Add the color to the proto-pal (if not full), and count it if it was unique.
					if (tileColors.add(color.cgbColor())) {
						++nbColorsInTile;
					}
				}
			}
		}

		if (tileColors.empty()) {
			// "Empty" proto-palettes screw with the packing process, so discard those
			attrs.protoPaletteID = AttrmapEntry::transparent;
			continue;
		}

		// Insert the proto-palette, making sure to avoid overlaps
		for (size_t n = 0; n < protoPalettes.size(); ++n) {
			switch (tileColors.compare(protoPalettes[n])) {
			case ProtoPalette::WE_BIGGER:
				protoPalettes[n] = tileColors; // Override them
				// Remove any other proto-palettes that we encompass
				// (Example [(0, 1), (0, 2)], inserting (0, 1, 2))
				/*
				 * The following code does its job, except that references to the removed
				 * proto-palettes are not updated, causing issues.
				 * TODO: overlap might not be detrimental to the packing algorithm.
				 * Investigation is necessary, especially if pathological cases are found.
				 *
				 * for (size_t i = protoPalettes.size(); --i != n;) {
				 *     if (tileColors.compare(protoPalettes[i]) == ProtoPalette::WE_BIGGER) {
				 *         protoPalettes.erase(protoPalettes.begin() + i);
				 *     }
				 * }
				 */
				[[fallthrough]];

			case ProtoPalette::THEY_BIGGER:
				// Do nothing, they already contain us
				attrs.protoPaletteID = n;
				goto contained;

			case ProtoPalette::NEITHER:
				break; // Keep going
			}
		}

		if (nbColorsInTile > options.maxOpaqueColors()) {
			fatal("Tile at (%" PRIu32 ", %" PRIu32 ") has %zu opaque colors, more than %" PRIu8 "!",
			      tile.x, tile.y, nbColorsInTile, options.maxOpaqueColors());
		}

		attrs.protoPaletteID = protoPalettes.size();
		if (protoPalettes.size() == AttrmapEntry::transparent) { // Check for overflow
			fatal("Reached %zu proto-palettes... sorry, this image is too much for me to handle :(",
			      AttrmapEntry::transparent);
		}
		protoPalettes.push_back(tileColors);
contained:;
	}

	options.verbosePrint(Options::VERB_INTERM, "Image contains %zu proto-palette%s\n",
	                     protoPalettes.size(), protoPalettes.size() != 1 ? "s" : "");
	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto const &protoPal : protoPalettes) {
			fputs("[ ", stderr);
			for (uint16_t color : protoPal) {
				fprintf(stderr, "$%04x, ", color);
			}
			fputs("]\n", stderr);
		}
	}

	if (options.palSpecType == Options::EMBEDDED) {
		generatePalSpec(png);
	}
	auto [mappings, palettes] = options.palSpecType == Options::NO_SPEC
	                                ? generatePalettes(protoPalettes, png)
	                                : makePalsAsSpecified(protoPalettes);
	outputPalettes(palettes);

	// If deduplication is not happening, we just need to output the tile data and/or maps as-is
	if (!options.allowDedup) {
		uint32_t const nbTilesH = png.getHeight() / 8, nbTilesW = png.getWidth() / 8;

		// Check the tile count
		if (nbTilesW * nbTilesH > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %" PRIu32 " tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      nbTilesW * nbTilesH, options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating unoptimized tile data...\n");
			unoptimized::outputTileData(png, attrmap, palettes, mappings);
		}

		if (options.tilemap.has_value() || options.attrmap.has_value()
		    || options.palmap.has_value()) {
			options.verbosePrint(
			    Options::VERB_LOG_ACT,
			    "Generating unoptimized tilemap and/or attrmap and/or palmap...\n");
			unoptimized::outputMaps(attrmap, mappings);
		}
	} else {
		// All of these require the deduplication process to be performed to be output
		options.verbosePrint(Options::VERB_LOG_ACT, "Deduplicating tiles...\n");
		optimized::UniqueTiles tiles = optimized::dedupTiles(png, attrmap, palettes, mappings);

		if (tiles.size() > options.maxNbTiles[0] + options.maxNbTiles[1]) {
			fatal("Image contains %zu tiles, exceeding the limit of %" PRIu16 " + %" PRIu16,
			      tiles.size(), options.maxNbTiles[0], options.maxNbTiles[1]);
		}

		if (options.output.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tile data...\n");
			optimized::outputTileData(tiles);
		}

		if (options.tilemap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized tilemap...\n");
			optimized::outputTilemap(attrmap);
		}

		if (options.attrmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized attrmap...\n");
			optimized::outputAttrmap(attrmap, mappings);
		}

		if (options.palmap.has_value()) {
			options.verbosePrint(Options::VERB_LOG_ACT, "Generating optimized palmap...\n");
			optimized::outputPalmap(attrmap, mappings);
		}
	}
}